

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_float_2_suite::test_three(void)

{
  value_type_conflict *pvVar1;
  moment<float,_2> filter;
  value_type_conflict local_60 [2];
  basic_moment<float,_2UL,_(trial::online::with)1> local_58;
  
  local_58.member.window.super_span<float,_2UL>.member.size = 0;
  local_58.member.window.super_span<float,_2UL>.member.next = 2;
  local_58.member.mean = 0.0;
  local_58.member.window.super_span<float,_2UL>.member.data = (pointer)&local_58;
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,1.0);
  local_60[0] = local_58.member.mean;
  pvVar1 = local_60 + 1;
  local_60[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x166,"void mean_float_2_suite::test_three()",local_60,pvVar1);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,3.0);
  local_60[0] = local_58.member.mean;
  local_60[1] = 2.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","2.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x168,"void mean_float_2_suite::test_three()",local_60,pvVar1);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,0.0);
  local_60[0] = local_58.member.mean;
  local_60[1] = 1.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.5f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x16a,"void mean_float_2_suite::test_three()",local_60,pvVar1);
  return;
}

Assistant:

void test_three()
{
    window::moment<float, 2> filter;
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(3.0f);
    TRIAL_TEST_EQ(filter.mean(), 2.0f);
    filter.push(0.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.5f);
}